

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereKeyStats(Parse *pParse,Index *pIdx,UnpackedRecord *pRec,int roundUp,tRowcnt *aStat)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ushort uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  u64 uVar10;
  int *piVar11;
  undefined4 in_register_0000000c;
  int *piVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  int local_68;
  uint local_64;
  
  piVar12 = (int *)CONCAT44(in_register_0000000c,roundUp);
  lVar5 = *(long *)&pParse->regRowid;
  uVar4 = *(ushort *)&pIdx->aiRowLogEst;
  uVar15 = (uint)uVar4;
  iVar18 = 0;
  local_64 = 0;
  local_68 = 0;
  uVar19 = (ulong)((pParse->constraintName).n * uVar15);
  do {
    uVar6 = (long)((int)uVar19 + iVar18) / 2;
    iVar8 = (int)uVar6;
    uVar20 = uVar6 & 0xffffffff;
    uVar6 = (ulong)(uint)(iVar8 >> 0x1f) << 0x20 | uVar6 & 0xffffffff;
    uVar7 = (long)uVar6 / (long)(int)uVar15;
    iVar9 = (int)uVar7;
    uVar16 = (uint)uVar4;
    if (iVar9 < 1) {
      uVar21 = iVar8 + 1;
    }
    else {
      lVar17 = (uVar7 & 0xffffffff) * 0x28;
      iVar13 = (int)((long)uVar6 % (long)(int)uVar15);
      lVar14 = (long)iVar13;
      uVar21 = iVar13 + 1U;
      if ((int)(iVar13 + 1U) <= (int)uVar16) {
        uVar21 = uVar16;
      }
      do {
        lVar1 = lVar14 + 1;
        if ((long)(ulong)uVar4 <= lVar1) goto LAB_00179135;
        lVar2 = lVar14 * 4;
        lVar3 = lVar14 * 4;
        lVar14 = lVar1;
      } while (*(int *)(*(long *)(lVar5 + -0x10 + lVar17) + lVar2) ==
               *(int *)(*(long *)(lVar17 + lVar5 + 0x18) + lVar3));
      uVar21 = (uint)lVar1;
    }
LAB_00179135:
    *(short *)&pIdx->aiRowLogEst = (short)uVar21;
    lVar17 = (long)iVar9 * 0x28;
    lVar14 = lVar5 + lVar17;
    iVar9 = sqlite3VdbeRecordCompare
                      (*(int *)(lVar5 + 8 + lVar17),*(void **)(lVar5 + lVar17),
                       (UnpackedRecord *)pIdx);
    lVar17 = (long)(int)uVar21;
    if (iVar9 < 0) {
      local_64 = *(int *)(*(long *)(lVar14 + 0x10) + -4 + lVar17 * 4) +
                 *(int *)(*(long *)(lVar14 + 0x18) + -4 + lVar17 * 4);
LAB_0017918c:
      iVar18 = iVar8 + 1;
      iVar9 = -1;
      uVar20 = uVar19;
    }
    else {
      if ((iVar9 == 0) && ((int)uVar21 < (int)uVar16)) {
        local_64 = *(uint *)(*(long *)(lVar14 + 0x18) + -4 + lVar17 * 4);
        goto LAB_0017918c;
      }
      local_68 = uVar21 - 1;
    }
    if ((iVar9 == 0) || (uVar19 = uVar20, (int)uVar20 <= iVar18)) {
      iVar18 = (int)uVar20 / (int)uVar16;
      if (iVar9 == 0) {
        *piVar12 = *(int *)(*(long *)(lVar5 + 0x18 + (long)iVar18 * 0x28) + (long)local_68 * 4);
        piVar11 = (int *)((long)local_68 * 4 + *(long *)(lVar5 + 0x10 + (long)iVar18 * 0x28));
      }
      else {
        if (iVar18 < (int)(pParse->constraintName).n) {
          uVar15 = *(uint *)(*(long *)(lVar5 + 0x18 + (long)iVar18 * 0x28) + (long)local_68 * 4);
        }
        else {
          uVar10 = sqlite3LogEstToInt(*(LogEst *)&pParse->pVdbe->db);
          uVar15 = (uint)uVar10;
        }
        iVar8 = uVar15 - local_64;
        if (uVar15 < local_64) {
          iVar8 = 0;
        }
        *piVar12 = (uint)(iVar8 << ((int)pRec != 0)) / 3 + local_64;
        piVar11 = (int *)(*(long *)&pParse->writeMask + (ulong)uVar4 * 4 + -4);
      }
      piVar12[1] = *piVar11;
      *(ushort *)&pIdx->aiRowLogEst = uVar4;
      return iVar18;
    }
  } while( true );
}

Assistant:

static int whereKeyStats(
  Parse *pParse,              /* Database connection */
  Index *pIdx,                /* Index to consider domain of */
  UnpackedRecord *pRec,       /* Vector of values to consider */
  int roundUp,                /* Round up if true.  Round down if false */
  tRowcnt *aStat              /* OUT: stats written here */
){
  IndexSample *aSample = pIdx->aSample;
  int iCol;                   /* Index of required stats in anEq[] etc. */
  int i;                      /* Index of first sample >= pRec */
  int iSample;                /* Smallest sample larger than or equal to pRec */
  int iMin = 0;               /* Smallest sample not yet tested */
  int iTest;                  /* Next sample to test */
  int res;                    /* Result of comparison operation */
  int nField;                 /* Number of fields in pRec */
  tRowcnt iLower = 0;         /* anLt[] + anEq[] of largest sample pRec is > */

#ifndef SQLITE_DEBUG
  UNUSED_PARAMETER( pParse );
#endif
  assert( pRec!=0 );
  assert( pIdx->nSample>0 );
  assert( pRec->nField>0 && pRec->nField<=pIdx->nSampleCol );

  /* Do a binary search to find the first sample greater than or equal
  ** to pRec. If pRec contains a single field, the set of samples to search
  ** is simply the aSample[] array. If the samples in aSample[] contain more
  ** than one fields, all fields following the first are ignored.
  **
  ** If pRec contains N fields, where N is more than one, then as well as the
  ** samples in aSample[] (truncated to N fields), the search also has to
  ** consider prefixes of those samples. For example, if the set of samples
  ** in aSample is:
  **
  **     aSample[0] = (a, 5) 
  **     aSample[1] = (a, 10) 
  **     aSample[2] = (b, 5) 
  **     aSample[3] = (c, 100) 
  **     aSample[4] = (c, 105)
  **
  ** Then the search space should ideally be the samples above and the 
  ** unique prefixes [a], [b] and [c]. But since that is hard to organize, 
  ** the code actually searches this set:
  **
  **     0: (a) 
  **     1: (a, 5) 
  **     2: (a, 10) 
  **     3: (a, 10) 
  **     4: (b) 
  **     5: (b, 5) 
  **     6: (c) 
  **     7: (c, 100) 
  **     8: (c, 105)
  **     9: (c, 105)
  **
  ** For each sample in the aSample[] array, N samples are present in the
  ** effective sample array. In the above, samples 0 and 1 are based on 
  ** sample aSample[0]. Samples 2 and 3 on aSample[1] etc.
  **
  ** Often, sample i of each block of N effective samples has (i+1) fields.
  ** Except, each sample may be extended to ensure that it is greater than or
  ** equal to the previous sample in the array. For example, in the above, 
  ** sample 2 is the first sample of a block of N samples, so at first it 
  ** appears that it should be 1 field in size. However, that would make it 
  ** smaller than sample 1, so the binary search would not work. As a result, 
  ** it is extended to two fields. The duplicates that this creates do not 
  ** cause any problems.
  */
  nField = pRec->nField;
  iCol = 0;
  iSample = pIdx->nSample * nField;
  do{
    int iSamp;                    /* Index in aSample[] of test sample */
    int n;                        /* Number of fields in test sample */

    iTest = (iMin+iSample)/2;
    iSamp = iTest / nField;
    if( iSamp>0 ){
      /* The proposed effective sample is a prefix of sample aSample[iSamp].
      ** Specifically, the shortest prefix of at least (1 + iTest%nField) 
      ** fields that is greater than the previous effective sample.  */
      for(n=(iTest % nField) + 1; n<nField; n++){
        if( aSample[iSamp-1].anLt[n-1]!=aSample[iSamp].anLt[n-1] ) break;
      }
    }else{
      n = iTest + 1;
    }

    pRec->nField = n;
    res = sqlite3VdbeRecordCompare(aSample[iSamp].n, aSample[iSamp].p, pRec);
    if( res<0 ){
      iLower = aSample[iSamp].anLt[n-1] + aSample[iSamp].anEq[n-1];
      iMin = iTest+1;
    }else if( res==0 && n<nField ){
      iLower = aSample[iSamp].anLt[n-1];
      iMin = iTest+1;
      res = -1;
    }else{
      iSample = iTest;
      iCol = n-1;
    }
  }while( res && iMin<iSample );
  i = iSample / nField;

#ifdef SQLITE_DEBUG
  /* The following assert statements check that the binary search code
  ** above found the right answer. This block serves no purpose other
  ** than to invoke the asserts.  */
  if( pParse->db->mallocFailed==0 ){
    if( res==0 ){
      /* If (res==0) is true, then pRec must be equal to sample i. */
      assert( i<pIdx->nSample );
      assert( iCol==nField-1 );
      pRec->nField = nField;
      assert( 0==sqlite3VdbeRecordCompare(aSample[i].n, aSample[i].p, pRec) 
           || pParse->db->mallocFailed 
      );
    }else{
      /* Unless i==pIdx->nSample, indicating that pRec is larger than
      ** all samples in the aSample[] array, pRec must be smaller than the
      ** (iCol+1) field prefix of sample i.  */
      assert( i<=pIdx->nSample && i>=0 );
      pRec->nField = iCol+1;
      assert( i==pIdx->nSample 
           || sqlite3VdbeRecordCompare(aSample[i].n, aSample[i].p, pRec)>0
           || pParse->db->mallocFailed );

      /* if i==0 and iCol==0, then record pRec is smaller than all samples
      ** in the aSample[] array. Otherwise, if (iCol>0) then pRec must
      ** be greater than or equal to the (iCol) field prefix of sample i.
      ** If (i>0), then pRec must also be greater than sample (i-1).  */
      if( iCol>0 ){
        pRec->nField = iCol;
        assert( sqlite3VdbeRecordCompare(aSample[i].n, aSample[i].p, pRec)<=0
             || pParse->db->mallocFailed );
      }
      if( i>0 ){
        pRec->nField = nField;
        assert( sqlite3VdbeRecordCompare(aSample[i-1].n, aSample[i-1].p, pRec)<0
             || pParse->db->mallocFailed );
      }
    }
  }
#endif /* ifdef SQLITE_DEBUG */

  if( res==0 ){
    /* Record pRec is equal to sample i */
    assert( iCol==nField-1 );
    aStat[0] = aSample[i].anLt[iCol];
    aStat[1] = aSample[i].anEq[iCol];
  }else{
    /* At this point, the (iCol+1) field prefix of aSample[i] is the first 
    ** sample that is greater than pRec. Or, if i==pIdx->nSample then pRec
    ** is larger than all samples in the array. */
    tRowcnt iUpper, iGap;
    if( i>=pIdx->nSample ){
      iUpper = sqlite3LogEstToInt(pIdx->aiRowLogEst[0]);
    }else{
      iUpper = aSample[i].anLt[iCol];
    }

    if( iLower>=iUpper ){
      iGap = 0;
    }else{
      iGap = iUpper - iLower;
    }
    if( roundUp ){
      iGap = (iGap*2)/3;
    }else{
      iGap = iGap/3;
    }
    aStat[0] = iLower + iGap;
    aStat[1] = pIdx->aAvgEq[nField-1];
  }

  /* Restore the pRec->nField value before returning.  */
  pRec->nField = nField;
  return i;
}